

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzRead(int *bzerror,BZFILE *b,void *buf,int len)

{
  Bool BVar1;
  int iVar2;
  size_t sVar3;
  bzFile *bzf;
  size_t n;
  Int32 ret;
  int len_local;
  void *buf_local;
  BZFILE *b_local;
  int *bzerror_local;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if (((b == (BZFILE *)0x0) || (*(undefined4 *)((long)b + 0x13e8) = 0, buf == (void *)0x0)) ||
     (len < 0)) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
    if (b != (BZFILE *)0x0) {
      *(undefined4 *)((long)b + 0x13e8) = 0xfffffffe;
    }
    bzerror_local._4_4_ = 0;
  }
  else if (*(char *)((long)b + 0x1394) == '\0') {
    if (len == 0) {
      if (bzerror != (int *)0x0) {
        *bzerror = 0;
      }
      if (b != (BZFILE *)0x0) {
        *(undefined4 *)((long)b + 0x13e8) = 0;
      }
      bzerror_local._4_4_ = 0;
    }
    else {
      *(int *)((long)b + 0x13b8) = len;
      *(void **)((long)b + 0x13b0) = buf;
      do {
        iVar2 = ferror(*b);
        if (iVar2 != 0) {
          if (bzerror != (int *)0x0) {
            *bzerror = -6;
          }
          if (b != (BZFILE *)0x0) {
            *(undefined4 *)((long)b + 0x13e8) = 0xfffffffa;
          }
          return 0;
        }
        if ((*(int *)((long)b + 0x13a0) == 0) && (BVar1 = myfeof(*b), BVar1 == '\0')) {
          sVar3 = fread((void *)((long)b + 8),1,5000,*b);
          iVar2 = ferror(*b);
          if (iVar2 != 0) {
            if (bzerror != (int *)0x0) {
              *bzerror = -6;
            }
            if (b != (BZFILE *)0x0) {
              *(undefined4 *)((long)b + 0x13e8) = 0xfffffffa;
            }
            return 0;
          }
          *(int *)((long)b + 0x1390) = (int)sVar3;
          *(undefined4 *)((long)b + 0x13a0) = *(undefined4 *)((long)b + 0x1390);
          *(long *)((long)b + 0x1398) = (long)b + 8;
        }
        iVar2 = BZ2_bzDecompress((bz_stream *)((long)b + 0x1398));
        if ((iVar2 != 0) && (iVar2 != 4)) {
          if (bzerror != (int *)0x0) {
            *bzerror = iVar2;
          }
          if (b != (BZFILE *)0x0) {
            *(int *)((long)b + 0x13e8) = iVar2;
          }
          return 0;
        }
        if ((((iVar2 == 0) && (BVar1 = myfeof(*b), BVar1 != '\0')) &&
            (*(int *)((long)b + 0x13a0) == 0)) && (*(int *)((long)b + 0x13b8) != 0)) {
          if (bzerror != (int *)0x0) {
            *bzerror = -7;
          }
          if (b != (BZFILE *)0x0) {
            *(undefined4 *)((long)b + 0x13e8) = 0xfffffff9;
          }
          return 0;
        }
        if (iVar2 == 4) {
          if (bzerror != (int *)0x0) {
            *bzerror = 4;
          }
          if (b != (BZFILE *)0x0) {
            *(undefined4 *)((long)b + 0x13e8) = 4;
          }
          return len - *(int *)((long)b + 0x13b8);
        }
      } while (*(int *)((long)b + 0x13b8) != 0);
      if (bzerror != (int *)0x0) {
        *bzerror = 0;
      }
      bzerror_local._4_4_ = len;
      if (b != (BZFILE *)0x0) {
        *(undefined4 *)((long)b + 0x13e8) = 0;
      }
    }
  }
  else {
    if (bzerror != (int *)0x0) {
      *bzerror = -1;
    }
    if (b != (BZFILE *)0x0) {
      *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
    }
    bzerror_local._4_4_ = 0;
  }
  return bzerror_local._4_4_;
}

Assistant:

int BZ2_bzRead 
           ( int*    bzerror, 
             BZFILE* b, 
             void*   buf, 
             int     len )
{
   Int32   ret;
   size_t  n;
   bzFile* bzf = (bzFile*)b;

   BZ_SETERR(BZ_OK);

   if (bzf == NULL || buf == NULL || len < 0)
      { BZ_SETERR(BZ_PARAM_ERROR); return 0; };

   if (bzf->writing)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return 0; };

   if (len == 0)
      { BZ_SETERR(BZ_OK); return 0; };

   bzf->strm.avail_out = len;
   bzf->strm.next_out = buf;

   while (True) {

      if (ferror(bzf->handle)) 
         { BZ_SETERR(BZ_IO_ERROR); return 0; };

      if (bzf->strm.avail_in == 0 && !myfeof(bzf->handle)) {
         n = fread ( bzf->buf, sizeof(UChar), 
                     BZ_MAX_UNUSED, bzf->handle );
         if (ferror(bzf->handle))
            { BZ_SETERR(BZ_IO_ERROR); return 0; };
         bzf->bufN = (Int32)n;
         bzf->strm.avail_in = bzf->bufN;
         bzf->strm.next_in = bzf->buf;
      }

      ret = BZ2_bzDecompress ( &(bzf->strm) );

      if (ret != BZ_OK && ret != BZ_STREAM_END)
         { BZ_SETERR(ret); return 0; };

      if (ret == BZ_OK && myfeof(bzf->handle) && 
          bzf->strm.avail_in == 0 && bzf->strm.avail_out > 0)
         { BZ_SETERR(BZ_UNEXPECTED_EOF); return 0; };

      if (ret == BZ_STREAM_END)
         { BZ_SETERR(BZ_STREAM_END);
           return len - bzf->strm.avail_out; };
      if (bzf->strm.avail_out == 0)
         { BZ_SETERR(BZ_OK); return len; };
      
   }

   return 0; /*not reached*/
}